

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O1

int __thiscall FuzzingParameterSet::get_random_amplitude(FuzzingParameterSet *this,int max)

{
  int iVar1;
  Range<int> local_1c;
  
  local_1c.min = (this->amplitude).min;
  iVar1 = (this->amplitude).max;
  local_1c.max = max;
  if (iVar1 < max) {
    local_1c.max = iVar1;
  }
  local_1c.step = 1;
  local_1c.dist._M_param._M_a = local_1c.min;
  local_1c.dist._M_param._M_b = local_1c.max;
  iVar1 = Range<int>::get_random_number(&local_1c,&this->gen);
  return iVar1;
}

Assistant:

int FuzzingParameterSet::get_random_amplitude(int max) {
  return Range<>(amplitude.min, std::min(amplitude.max, max)).get_random_number(gen);
}